

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  undefined1 uVar2;
  char cVar3;
  numpunct *pnVar4;
  basic_appender<char> bVar5;
  undefined8 uVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  undefined8 uVar13;
  uint uVar14;
  long lVar15;
  size_t sVar16;
  buffer<char> *buf;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  char *significand;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_de [2];
  undefined8 local_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d4;
  int local_c4;
  undefined1 local_c0 [8];
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = (undefined1  [8])f->significand;
  local_dc._4_4_ = f->significand_size;
  uVar7 = (ulong)((local_dc._4_4_ + 1) - (uint)(s == none));
  local_de[1] = '0';
  cVar3 = '.';
  local_d4._M_allocated_capacity._0_4_ = s;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    local_d4._M_allocated_capacity._4_4_ = exp_upper;
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)local_b8);
    }
    else {
      std::locale::locale((locale *)local_b8,(locale *)loc.locale_);
    }
    pnVar4 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_b8);
    cVar3 = (**(code **)(*(long *)pnVar4 + 0x10))(pnVar4);
    std::locale::~locale((locale *)local_b8);
    exp_upper = local_d4._M_allocated_capacity._4_4_;
  }
  uVar6 = auStack_a4._4_8_;
  uVar14 = f->exponent;
  local_c4 = local_dc._4_4_ + uVar14;
  uVar1 = (specs->super_basic_specs).data_;
  iVar11 = specs->precision;
  bVar9 = (byte)uVar1 & 7;
  local_de[0] = cVar3;
  local_d4._4_8_ = out.container;
  if (bVar9 != 1) {
    if ((uVar1 & 7) == 2) {
LAB_00141e4c:
      if ((int)uVar14 < 0) {
        if (local_c4 < 1) {
          local_70._M_allocated_capacity._0_4_ = -local_c4;
          if ((local_dc._4_4_ == 0) &&
             (SBORROW4(iVar11,-local_c4) != iVar11 + local_c4 < 0 && -1 < iVar11)) {
            local_70._M_allocated_capacity._0_4_ = iVar11;
          }
          uVar14 = 1;
          if (local_dc._4_4_ == 0 && local_70._0_4_ == 0) {
            uVar14 = uVar1 >> 0xd & 1;
          }
          local_b8._8_8_ = &local_dc;
          local_dc._0_1_ = (char)uVar14;
          sVar16 = (local_70._0_4_ + uVar14 + 1) + uVar7;
          local_b8._0_8_ = &local_d4;
          unique0x00004e80 = local_de;
          auStack_a4._4_8_ = &local_70;
          auStack_a4._12_8_ = local_de + 1;
          local_90 = (format_specs *)local_c0;
          local_88._M_allocated_capacity = (long)&local_dc + 4;
          bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                            (out,specs,sVar16,sVar16,(anon_class_56_7_88befd79 *)local_b8);
          return (basic_appender<char>)bVar5.container;
        }
        uVar14 = iVar11 - local_dc._4_4_ & (int)(uVar1 << 0x12) >> 0x1f;
        local_dc._0_4_ = uVar14;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        iVar11 = 0;
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        sVar16 = uVar14 + uVar7;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_b8._0_8_;
        do {
          iVar10 = 0x7fffffff;
          if (local_90 != (format_specs *)0x0) {
            if (paVar8 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_b8._8_8_ + local_b8._0_8_)) {
              uVar14 = (uint)(char)*(byte *)((long)(local_b8._8_8_ + local_b8._0_8_) + -1);
            }
            else {
              bVar9 = paVar8->_M_local_buf[0];
              if ((byte)(bVar9 + 0x81) < 0x82) goto LAB_001421c3;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(paVar8->_M_local_buf + 1);
              uVar14 = (uint)bVar9;
            }
            iVar11 = iVar11 + uVar14;
            iVar10 = iVar11;
          }
LAB_001421c3:
          sVar16 = sVar16 + 1;
        } while (iVar10 < local_c4);
        local_70._M_allocated_capacity = (size_type)&local_d4;
        local_70._8_8_ = local_c0;
        local_60._M_allocated_capacity = (long)&local_dc + 4;
        local_60._8_8_ = &local_c4;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_de;
        local_40._M_allocated_capacity = (size_type)&local_dc;
        local_40._8_8_ = local_de + 1;
        local_48 = (digit_grouping<char> *)local_b8;
        bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                          ((basic_appender<char>)local_d4._4_8_,specs,sVar16,sVar16,
                           (anon_class_64_8_085c650e *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_a4._12_8_ != &local_88) {
          operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
        }
        uVar6 = stack0xffffffffffffff58;
        uVar13 = local_b8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_b8 + 0x10)) {
          return (basic_appender<char>)bVar5.container;
        }
      }
      else {
        lVar15 = uVar14 + uVar7;
        local_dc._0_4_ = iVar11 - local_c4;
        if ((uVar1 >> 0xd & 1) != 0) {
          if (bVar9 != 2 && (int)(undefined4)local_dc < 1) {
            local_dc._0_4_ = 0;
          }
          lVar15 = lVar15 + 1;
          if (0 < (long)(int)(undefined4)local_dc) {
            lVar15 = lVar15 + (int)(undefined4)local_dc;
          }
        }
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        sVar16 = lVar15 - 1;
        iVar11 = 0;
        uVar6 = local_70._0_8_;
        do {
          iVar10 = 0x7fffffff;
          if (local_48 != (digit_grouping<char> *)0x0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_70._8_8_ + local_70._0_8_)) {
              uVar14 = (uint)(char)*(byte *)((long)(local_70._8_8_ + local_70._0_8_) + -1);
            }
            else {
              bVar9 = *(byte *)uVar6;
              if ((byte)(bVar9 + 0x81) < 0x82) goto LAB_00141ef1;
              uVar6 = uVar6 + 1;
              uVar14 = (uint)bVar9;
            }
            iVar11 = iVar11 + uVar14;
            iVar10 = iVar11;
          }
LAB_00141ef1:
          sVar16 = sVar16 + 1;
        } while (iVar10 < local_c4);
        local_b8._0_8_ = &local_d4;
        local_b8._8_8_ = local_c0;
        unique0x00004e80 = (long)&local_dc + 4;
        local_88._M_allocated_capacity = (size_type)local_de;
        local_88._8_8_ = &local_dc;
        local_78 = local_de + 1;
        auStack_a4._4_8_ = f;
        auStack_a4._12_8_ = &local_70;
        local_90 = specs;
        bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                          ((basic_appender<char>)local_d4._4_8_,specs,sVar16,sVar16,
                           (anon_class_72_9_eb40e20e *)local_b8);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40._M_allocated_capacity + 1);
        }
        uVar6 = local_60._M_allocated_capacity;
        uVar13 = local_70._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._0_8_ == &local_60) {
          return (basic_appender<char>)bVar5.container;
        }
      }
      operator_delete((void *)uVar13,uVar6 + 1);
      return (basic_appender<char>)bVar5.container;
    }
    if (-4 < local_c4) {
      if (0 < iVar11) {
        exp_upper = iVar11;
      }
      if (local_c4 <= exp_upper) goto LAB_00141e4c;
    }
  }
  iVar10 = local_dc._4_4_ + uVar14 + -1;
  if ((uVar1 >> 0xd & 1) == 0) {
    uVar12 = 0;
    if (local_dc._4_4_ == 1) {
      local_de[0] = '\0';
    }
  }
  else {
    uVar12 = 0;
    if (0 < iVar11 - local_dc._4_4_) {
      uVar12 = (ulong)(uint)(iVar11 - local_dc._4_4_);
    }
    uVar7 = uVar7 + uVar12;
  }
  iVar11 = 1 - local_c4;
  if (0 < local_c4) {
    iVar11 = iVar10;
  }
  lVar15 = 2;
  if (99 < iVar11) {
    lVar15 = (ulong)(999 < iVar11) + 3;
  }
  sVar16 = (3 - (ulong)(local_de[0] == '\0')) + uVar7 + lVar15;
  local_b8._0_4_ = local_d4._0_4_;
  local_b8._8_8_ = local_c0;
  auStack_a4[0] = local_de[0];
  local_b8._16_4_ = local_dc._4_4_;
  auStack_a4._4_5_ = CONCAT14('0',(int)uVar12);
  auStack_a4._10_2_ = SUB82(uVar6,6);
  auStack_a4._4_8_ =
       CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
       0x450000000000;
  auStack_a4._12_4_ = iVar10;
  if (specs->width < 1) {
    uVar7 = sVar16 + (out.container)->size_;
    if ((out.container)->capacity_ < uVar7) {
      (*(out.container)->grow_)(out.container,uVar7);
    }
    if (local_b8._0_4_ != none) {
      iVar11 = local_b8._0_4_ << 3;
      uVar7 = (out.container)->size_ + 1;
      if ((out.container)->capacity_ < uVar7) {
        (*(out.container)->grow_)(out.container,uVar7);
      }
      sVar16 = (out.container)->size_;
      (out.container)->size_ = sVar16 + 1;
      (out.container)->ptr_[sVar16] = (char)(0x202b2d00 >> ((byte)iVar11 & 0x1f));
    }
    bVar5 = write_significand<fmt::v11::basic_appender<char>,char>
                      (out,(char *)local_b8._8_8_,local_b8._16_4_,1,auStack_a4[0]);
    if (0 < (int)auStack_a4._4_4_) {
      bVar5 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar5,auStack_a4._4_4_,auStack_a4 + 8)
      ;
    }
    uVar2 = auStack_a4[9];
    uVar7 = (bVar5.container)->size_ + 1;
    if ((bVar5.container)->capacity_ < uVar7) {
      (*(bVar5.container)->grow_)(bVar5.container,uVar7);
    }
    sVar16 = (bVar5.container)->size_;
    (bVar5.container)->size_ = sVar16 + 1;
    (bVar5.container)->ptr_[sVar16] = uVar2;
    bVar5 = write_exponent<char,fmt::v11::basic_appender<char>>(auStack_a4._12_4_,bVar5);
  }
  else {
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,sVar16,sVar16,(anon_class_40_8_fd1bf2f9 *)local_b8);
  }
  return (basic_appender<char>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}